

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav * drwav_open_memory_write(void **ppData,size_t *pDataSize,drwav_data_format *pFormat)

{
  drwav *pWav;
  drwav__memory_stream_write memoryStreamWrite;
  drwav_data_format *pFormat_local;
  size_t *pDataSize_local;
  void **ppData_local;
  
  if (ppData == (void **)0x0) {
    ppData_local = (void **)0x0;
  }
  else {
    *ppData = (void *)0x0;
    *pDataSize = 0;
    memoryStreamWrite.currentWritePos = (size_t)pFormat;
    memset(&pWav,0,0x28);
    memoryStreamWrite.pDataSize = (size_t *)0x0;
    memoryStreamWrite.dataSize = 0;
    memoryStreamWrite.dataCapacity = 0;
    pWav = (drwav *)ppData;
    memoryStreamWrite.ppData = (void **)pDataSize;
    ppData_local = &drwav_open_write((drwav_data_format *)memoryStreamWrite.currentWritePos,
                                     drwav__on_write_memory,drwav__on_seek_memory_write,&pWav)->
                    onRead;
    if ((drwav *)ppData_local == (drwav *)0x0) {
      ppData_local = (void **)0x0;
    }
    else {
      memcpy(&((drwav *)ppData_local)->memoryStreamWrite,&pWav,0x28);
      ((drwav *)ppData_local)->pUserData = &((drwav *)ppData_local)->memoryStreamWrite;
    }
  }
  return (drwav *)ppData_local;
}

Assistant:

drwav* drwav_open_memory_write(void** ppData, size_t* pDataSize, const drwav_data_format* pFormat) {
    if (ppData == NULL) {
        return NULL;
    }

    *ppData = NULL;  // Important because we're using realloc()!
    *pDataSize = 0;

    drwav__memory_stream_write memoryStreamWrite;
    drwav_zero_memory(&memoryStreamWrite, sizeof(memoryStreamWrite));
    memoryStreamWrite.ppData = ppData;
    memoryStreamWrite.pDataSize = pDataSize;
    memoryStreamWrite.dataSize = 0;
    memoryStreamWrite.dataCapacity = 0;
    memoryStreamWrite.currentWritePos = 0;

    drwav* pWav =
        drwav_open_write(pFormat, drwav__on_write_memory, drwav__on_seek_memory_write, (void*)&memoryStreamWrite);
    if (pWav == NULL) {
        return NULL;
    }

    pWav->memoryStreamWrite = memoryStreamWrite;
    pWav->pUserData = &pWav->memoryStreamWrite;
    return pWav;
}